

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrCopy(Vec_Ptr_t *pDest,Vec_Ptr_t *pSour)

{
  Vec_Ptr_t *pSour_local;
  Vec_Ptr_t *pDest_local;
  
  pDest->nSize = 0;
  Vec_PtrGrow(pDest,pSour->nSize);
  memcpy(pDest->pArray,pSour->pArray,(long)pSour->nSize << 3);
  pDest->nSize = pSour->nSize;
  return;
}

Assistant:

static inline void Vec_PtrCopy( Vec_Ptr_t * pDest, Vec_Ptr_t * pSour )
{
    pDest->nSize = 0;
    Vec_PtrGrow( pDest, pSour->nSize );
    memcpy( pDest->pArray, pSour->pArray, sizeof(void *) * pSour->nSize );
    pDest->nSize = pSour->nSize;
}